

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateSubFboRenderCase::render
          (InvalidateSubFboRenderCase *this,Surface *dst)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Context *pCVar8;
  float *pfVar9;
  size_type sVar10;
  ContextWrapper *pCVar11;
  bool bVar12;
  bool bVar13;
  deUint32 *local_3b0;
  bool local_322;
  Vector<float,_3> local_318;
  Vector<float,_3> local_30c;
  Vector<float,_4> local_300;
  Vector<float,_4> local_2f0;
  Vec4 local_2e0;
  Vector<float,_4> local_2d0;
  Vector<float,_4> local_2c0;
  Vector<float,_4> local_2b0;
  Vector<float,_3> local_2a0;
  Vector<float,_3> local_294;
  Vector<float,_4> local_288;
  Vector<float,_4> local_278;
  Vec4 local_268;
  Vector<float,_4> local_258;
  Vector<float,_4> local_248;
  Vector<float,_4> local_238;
  deUint32 local_228;
  deUint32 flatShaderID;
  undefined1 local_218 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  FlatColorShader flatShader;
  int invalidateH;
  int invalidateW;
  int invalidateY;
  int invalidateX;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  Vec4 cScale;
  Vec4 *cBias;
  undefined1 local_68 [6];
  bool stencil;
  bool depth;
  TextureFormatInfo colorFmtInfo;
  TextureFormat depthStencilFmt;
  TextureFormat colorFmt;
  Surface *dst_local;
  InvalidateSubFboRenderCase *this_local;
  
  depthStencilFmt = glu::mapGLInternalFormat(this->m_colorFmt);
  if (this->m_depthStencilFmt == 0) {
    tcu::TextureFormat::TextureFormat((TextureFormat *)(colorFmtInfo.lookupBias.m_data + 2));
  }
  else {
    colorFmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_depthStencilFmt);
  }
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_68,&depthStencilFmt);
  bVar12 = colorFmtInfo.lookupBias.m_data[2] == 2.52234e-44;
  bVar13 = colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  local_322 = colorFmtInfo.lookupBias.m_data[2] == 2.66247e-44 ||
              colorFmtInfo.lookupBias.m_data[2] == 2.8026e-44;
  cScale.m_data._8_8_ = local_68;
  tcu::operator-((tcu *)&colorRbo,(Vector<float,_4> *)(colorFmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)cScale.m_data._8_8_);
  depthStencilRbo = 0;
  invalidateX = 0;
  invalidateY = 0;
  pCVar11 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar2 = sglr::ContextWrapper::getWidth(pCVar11);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 3;
  }
  iVar3 = sglr::ContextWrapper::getHeight(pCVar11);
  if (iVar3 < 0) {
    iVar3 = iVar3 + 3;
  }
  iVar4 = sglr::ContextWrapper::getWidth(pCVar11);
  iVar5 = sglr::ContextWrapper::getHeight(pCVar11);
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT_VEC4);
  getFBODiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218,
             this->m_invalidateBuffers);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_228 = (*pCVar8->_vptr_Context[0x75])
                        (pCVar8,&attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,(deUint32 *)&invalidateX);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,invalidateX);
  pCVar11 = &(this->super_FboTestCase).super_ContextWrapper;
  dVar1 = this->m_colorFmt;
  iVar6 = sglr::ContextWrapper::getWidth(pCVar11);
  iVar7 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  sglr::ContextWrapper::glRenderbufferStorage(pCVar11,0x8d41,dVar1,iVar6,iVar7);
  if (this->m_depthStencilFmt != 0) {
    sglr::ContextWrapper::glGenRenderbuffers
              (&(this->super_FboTestCase).super_ContextWrapper,1,(deUint32 *)&invalidateY);
    sglr::ContextWrapper::glBindRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,invalidateY);
    pCVar11 = &(this->super_FboTestCase).super_ContextWrapper;
    dVar1 = this->m_depthStencilFmt;
    iVar6 = sglr::ContextWrapper::getWidth(pCVar11);
    iVar7 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
    sglr::ContextWrapper::glRenderbufferStorage(pCVar11,0x8d41,dVar1,iVar6,iVar7);
  }
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthStencilRbo);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthStencilRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,invalidateX);
  if (bVar12 || bVar13) {
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0x8d41,invalidateY);
  }
  if (local_322) {
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0x8d41,invalidateY);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  tcu::Vector<float,_4>::Vector(&local_258,0.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_248,&local_258,(Vector<float,_4> *)&colorRbo);
  tcu::operator+((tcu *)&local_238,&local_248,(Vector<float,_4> *)cScale.m_data._8_8_);
  pfVar9 = tcu::Vector<float,_4>::getPtr(&local_238);
  sglr::ContextWrapper::glClearBufferfv
            (&(this->super_FboTestCase).super_ContextWrapper,0x1800,0,pfVar9);
  sglr::ContextWrapper::glClearBufferfi
            (&(this->super_FboTestCase).super_ContextWrapper,0x84f9,0,1.0,0);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_228;
  tcu::Vector<float,_4>::Vector(&local_288,1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_278,&local_288,(Vector<float,_4> *)&colorRbo);
  tcu::operator+((tcu *)&local_268,&local_278,(Vector<float,_4> *)cScale.m_data._8_8_);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar8,dVar1,&local_268);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_228;
  tcu::Vector<float,_3>::Vector(&local_294,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_2a0,1.0,1.0,1.0);
  sglr::drawQuad(pCVar8,dVar1,&local_294,&local_2a0);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218);
  bVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218);
  if (bVar12) {
    local_3b0 = (deUint32 *)0x0;
  }
  else {
    local_3b0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218,0);
  }
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,(int)sVar10,local_3b0,iVar2 >> 2
             ,iVar3 >> 2,iVar4 / 2,iVar5 / 2);
  sglr::ContextWrapper::glScissor
            (&(this->super_FboTestCase).super_ContextWrapper,iVar2 >> 2,iVar3 >> 2,iVar4 / 2,
             iVar5 / 2);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xc11);
  if ((this->m_invalidateBuffers & 0x4000) != 0) {
    tcu::Vector<float,_4>::Vector(&local_2d0,0.0,1.0,0.0,1.0);
    tcu::operator*((tcu *)&local_2c0,&local_2d0,(Vector<float,_4> *)&colorRbo);
    tcu::operator+((tcu *)&local_2b0,&local_2c0,(Vector<float,_4> *)cScale.m_data._8_8_);
    pfVar9 = tcu::Vector<float,_4>::getPtr(&local_2b0);
    sglr::ContextWrapper::glClearBufferfv
              (&(this->super_FboTestCase).super_ContextWrapper,0x1800,0,pfVar9);
  }
  sglr::ContextWrapper::glClear
            (&(this->super_FboTestCase).super_ContextWrapper,this->m_invalidateBuffers & 0xffffbfff)
  ;
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xc11);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xbe2);
  sglr::ContextWrapper::glBlendFunc(&(this->super_FboTestCase).super_ContextWrapper,1,1);
  sglr::ContextWrapper::glBlendEquation(&(this->super_FboTestCase).super_ContextWrapper,0x8006);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_228;
  tcu::Vector<float,_4>::Vector(&local_300,0.0,0.0,1.0,1.0);
  tcu::operator*((tcu *)&local_2f0,&local_300,(Vector<float,_4> *)&colorRbo);
  tcu::operator+((tcu *)&local_2e0,&local_2f0,(Vector<float,_4> *)cScale.m_data._8_8_);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar8,dVar1,&local_2e0);
  pCVar8 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_228;
  tcu::Vector<float,_3>::Vector(&local_30c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_318,1.0,1.0,0.0);
  sglr::drawQuad(pCVar8,dVar1,&local_30c,&local_318);
  iVar2 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar2,iVar3,&depthStencilFmt,
             (Vec4 *)(colorFmtInfo.valueMax.m_data + 2),
             (Vec4 *)(colorFmtInfo.lookupScale.m_data + 2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_218);
  FboTestUtil::FlatColorShader::~FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFmt);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		const tcu::Vec4&		cBias					= colorFmtInfo.valueMin;
		tcu::Vec4				cScale					= colorFmtInfo.valueMax-colorFmtInfo.valueMin;
		deUint32				fbo						= 0;
		deUint32				colorRbo				= 0;
		deUint32				depthStencilRbo			= 0;
		int						invalidateX				= getWidth()	/ 4;
		int						invalidateY				= getHeight()	/ 4;
		int						invalidateW				= getWidth()	/ 2;
		int						invalidateH				= getHeight()	/ 2;
		FlatColorShader			flatShader				(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		// Create fbo.
		glGenRenderbuffers		(1, &colorRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, m_colorFmt, getWidth(), getHeight());

		if (m_depthStencilFmt != GL_NONE)
		{
			glGenRenderbuffers		(1, &depthStencilRbo);
			glBindRenderbuffer		(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorage	(GL_RENDERBUFFER, m_depthStencilFmt, getWidth(), getHeight());
		}

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

		if (depth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		if (stencil)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearBufferfv	(GL_COLOR, 0, (Vec4(0.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias).getPtr());
		glClearBufferfi	(GL_DEPTH_STENCIL, 0, 1.0f, 0);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), attachments.empty() ? DE_NULL : &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Clear invalidated buffers.
		glScissor	(invalidateX, invalidateY, invalidateW, invalidateH);
		glEnable	(GL_SCISSOR_TEST);

		if (m_invalidateBuffers & GL_COLOR_BUFFER_BIT)
			glClearBufferfv(GL_COLOR, 0, (Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias).getPtr());

		glClear		(m_invalidateBuffers & ~GL_COLOR_BUFFER_BIT);
		glDisable	(GL_SCISSOR_TEST);

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}